

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

bool __thiscall
gl4cts::GPUShaderFP64Test1::verifyErrorGenerationWhenCallingDoubleUniformFunctionsWithInvalidCount
          (GPUShaderFP64Test1 *this)

{
  bool bVar1;
  int iVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  TestError *this_00;
  TestLog *this_01;
  MessageBuilder *pMVar4;
  char *local_310;
  MessageBuilder local_308;
  int local_188;
  GLenum error_code;
  byte local_171;
  uint local_170;
  uint uStack_16c;
  bool is_matrix_uniform;
  GLint uniform_location;
  uint n_uniform;
  _uniform_function uniform_function;
  uint n_uniform_function;
  uint n_uniforms;
  uint n_uniform_functions;
  GLint uniforms [29];
  GLint local_d8 [2];
  _uniform_function uniform_functions [13];
  bool result;
  Functions *gl;
  GLdouble double_values [16];
  GPUShaderFP64Test1 *this_local;
  
  memcpy(&gl,&DAT_029ee8e0,0x80);
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar3->_vptr_RenderContext[3])();
  register0x00000000 = CONCAT44(extraout_var,iVar2);
  uniform_functions[0xb]._3_1_ = 1;
  memcpy(local_d8,&DAT_029ee960,0x34);
  n_uniforms = this->m_po_bool_uniform_location;
  n_uniform_functions = this->m_po_bvec2_uniform_location;
  uniforms[0] = this->m_po_bvec3_uniform_location;
  uniforms[1] = this->m_po_bvec4_uniform_location;
  uniforms[2] = this->m_po_dmat2_uniform_location;
  uniforms[3] = this->m_po_dmat2x3_uniform_location;
  uniforms[4] = this->m_po_dmat2x4_uniform_location;
  uniforms[5] = this->m_po_dmat3_uniform_location;
  uniforms[6] = this->m_po_dmat3x2_uniform_location;
  uniforms[7] = this->m_po_dmat3x4_uniform_location;
  uniforms[8] = this->m_po_dmat4_uniform_location;
  uniforms[9] = this->m_po_dmat4x2_uniform_location;
  uniforms[10] = this->m_po_dmat4x3_uniform_location;
  uniforms[0xb] = this->m_po_double_uniform_location;
  uniforms[0xc] = this->m_po_dvec2_uniform_location;
  uniforms[0xd] = this->m_po_dvec3_uniform_location;
  uniforms[0xe] = this->m_po_dvec4_uniform_location;
  uniforms[0xf] = this->m_po_float_uniform_location;
  uniforms[0x10] = this->m_po_int_uniform_location;
  uniforms[0x11] = this->m_po_ivec2_uniform_location;
  uniforms[0x12] = this->m_po_ivec3_uniform_location;
  uniforms[0x13] = this->m_po_ivec4_uniform_location;
  uniforms[0x14] = this->m_po_uint_uniform_location;
  uniforms[0x15] = this->m_po_uvec2_uniform_location;
  uniforms[0x16] = this->m_po_uvec3_uniform_location;
  uniforms[0x17] = this->m_po_uvec4_uniform_location;
  uniforms[0x18] = this->m_po_vec2_uniform_location;
  uniforms[0x19] = this->m_po_vec3_uniform_location;
  uniforms[0x1a] = this->m_po_vec4_uniform_location;
  n_uniform_function = 0xd;
  uniform_function = UNIFORM_FUNCTION_MATRIX4X3DV|UNIFORM_FUNCTION_MATRIX3X4DV;
  for (n_uniform = 0; n_uniform < 0xd; n_uniform = n_uniform + 1) {
    uniform_location = local_d8[n_uniform];
    for (uStack_16c = 0; uStack_16c < 0x1d; uStack_16c = uStack_16c + 1) {
      local_170 = (&n_uniforms)[uStack_16c];
      local_171 = isMatrixUniform(this,local_170);
      if ((((bool)local_171) || (bVar1 = isMatrixUniformFunction(this,uniform_location), !bVar1)) &&
         (((local_171 & 1) != 1 || (bVar1 = isMatrixUniformFunction(this,uniform_location), bVar1)))
         ) {
        switch(uniform_location) {
        case 1:
          (**(code **)(stack0xffffffffffffff60 + 0x14d8))(local_170,2,&gl);
          break;
        default:
          this_00 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (this_00,"Unrecognized uniform function",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                     ,0x9f0);
          __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
        case 3:
          (**(code **)(stack0xffffffffffffff60 + 0x1518))(local_170,2,&gl);
          break;
        case 5:
          (**(code **)(stack0xffffffffffffff60 + 0x1558))(local_170,2,&gl);
          break;
        case 7:
          (**(code **)(stack0xffffffffffffff60 + 0x1598))(local_170,2,&gl);
          break;
        case 8:
          (**(code **)(stack0xffffffffffffff60 + 0x15d8))(local_170,2,0,&gl);
          break;
        case 9:
          (**(code **)(stack0xffffffffffffff60 + 0x15e8))(local_170,2,0,&gl);
          break;
        case 10:
          (**(code **)(stack0xffffffffffffff60 + 0x15f8))(local_170,2,0,&gl);
          break;
        case 0xb:
          (**(code **)(stack0xffffffffffffff60 + 0x1608))(local_170,2,0,&gl);
          break;
        case 0xc:
          (**(code **)(stack0xffffffffffffff60 + 0x1618))(local_170,2,0,&gl);
          break;
        case 0xd:
          (**(code **)(stack0xffffffffffffff60 + 0x1628))(local_170,2,0,&gl);
          break;
        case 0xe:
          (**(code **)(stack0xffffffffffffff60 + 0x1638))(local_170,2,0,&gl);
          break;
        case 0xf:
          (**(code **)(stack0xffffffffffffff60 + 0x1648))(local_170,2,0,&gl);
          break;
        case 0x10:
          (**(code **)(stack0xffffffffffffff60 + 0x1658))(local_170,2,0,&gl);
        }
        local_188 = (**(code **)(stack0xffffffffffffff60 + 0x800))();
        if (local_188 != 0x502) {
          this_01 = tcu::TestContext::getLog
                              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
          tcu::TestLog::operator<<(&local_308,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar4 = tcu::MessageBuilder::operator<<(&local_308,(char (*) [10])"Function ");
          local_310 = getUniformFunctionString(this,uniform_location);
          pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_310);
          pMVar4 = tcu::MessageBuilder::operator<<
                             (pMVar4,(char (*) [95])
                                     "() was called with an invalid count argument but did not generate a GL_INVALID_OPERATION error"
                             );
          tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_308);
          uniform_functions[0xb]._3_1_ = UNIFORM_FUNCTION_1D >> 0x18;
        }
      }
    }
  }
  return (bool)(uniform_functions[0xb]._3_1_ & 1);
}

Assistant:

bool GPUShaderFP64Test1::verifyErrorGenerationWhenCallingDoubleUniformFunctionsWithInvalidCount()
{
	const glw::GLdouble double_values[16] = { 1.0, 2.0,  3.0,  4.0,  5.0,  6.0,  7.0,  8.0,
											  9.0, 10.0, 11.0, 12.0, 13.0, 14.0, 15.0, 16.0 };
	const glw::Functions&   gl					= m_context.getRenderContext().getFunctions();
	bool					result				= true;
	const _uniform_function uniform_functions[] = { UNIFORM_FUNCTION_1DV,		  UNIFORM_FUNCTION_2DV,
													UNIFORM_FUNCTION_3DV,		  UNIFORM_FUNCTION_4DV,
													UNIFORM_FUNCTION_MATRIX2DV,   UNIFORM_FUNCTION_MATRIX2X3DV,
													UNIFORM_FUNCTION_MATRIX2X4DV, UNIFORM_FUNCTION_MATRIX3DV,
													UNIFORM_FUNCTION_MATRIX3X2DV, UNIFORM_FUNCTION_MATRIX3X4DV,
													UNIFORM_FUNCTION_MATRIX4DV,   UNIFORM_FUNCTION_MATRIX4X2DV,
													UNIFORM_FUNCTION_MATRIX4X3DV };
	const glw::GLint uniforms[] = {
		m_po_bool_uniform_location,	m_po_bvec2_uniform_location,  m_po_bvec3_uniform_location,
		m_po_bvec4_uniform_location,   m_po_dmat2_uniform_location,  m_po_dmat2x3_uniform_location,
		m_po_dmat2x4_uniform_location, m_po_dmat3_uniform_location,  m_po_dmat3x2_uniform_location,
		m_po_dmat3x4_uniform_location, m_po_dmat4_uniform_location,  m_po_dmat4x2_uniform_location,
		m_po_dmat4x3_uniform_location, m_po_double_uniform_location, m_po_dvec2_uniform_location,
		m_po_dvec3_uniform_location,   m_po_dvec4_uniform_location,  m_po_float_uniform_location,
		m_po_int_uniform_location,	 m_po_ivec2_uniform_location,  m_po_ivec3_uniform_location,
		m_po_ivec4_uniform_location,   m_po_uint_uniform_location,   m_po_uvec2_uniform_location,
		m_po_uvec3_uniform_location,   m_po_uvec4_uniform_location,  m_po_vec2_uniform_location,
		m_po_vec3_uniform_location,	m_po_vec4_uniform_location
	};

	const unsigned int n_uniform_functions = sizeof(uniform_functions) / sizeof(uniform_functions[0]);
	const unsigned int n_uniforms		   = sizeof(uniforms) / sizeof(uniforms[0]);

	for (unsigned int n_uniform_function = 0; n_uniform_function < n_uniform_functions; ++n_uniform_function)
	{
		_uniform_function uniform_function = uniform_functions[n_uniform_function];

		for (unsigned int n_uniform = 0; n_uniform < n_uniforms; ++n_uniform)
		{
			glw::GLint uniform_location = uniforms[n_uniform];

			/* Make sure we only use glUniformMatrix*() functions with matrix uniforms,
			 * and glUniform*() functions with vector uniforms.
			 */
			bool is_matrix_uniform = isMatrixUniform(uniform_location);

			if (((false == is_matrix_uniform) && (true == isMatrixUniformFunction(uniform_function))) ||
				((true == is_matrix_uniform) && (false == isMatrixUniformFunction(uniform_function))))
			{
				continue;
			}

			/* Issue the call with an invalid <count> argument */
			switch (uniform_function)
			{
			case UNIFORM_FUNCTION_1DV:
				gl.uniform1dv(uniform_location, 2, double_values);
				break;
			case UNIFORM_FUNCTION_2DV:
				gl.uniform2dv(uniform_location, 2, double_values);
				break;
			case UNIFORM_FUNCTION_3DV:
				gl.uniform3dv(uniform_location, 2, double_values);
				break;
			case UNIFORM_FUNCTION_4DV:
				gl.uniform4dv(uniform_location, 2, double_values);
				break;
			case UNIFORM_FUNCTION_MATRIX2DV:
				gl.uniformMatrix2dv(uniform_location, 2, GL_FALSE, double_values);
				break;
			case UNIFORM_FUNCTION_MATRIX2X3DV:
				gl.uniformMatrix2x3dv(uniform_location, 2, GL_FALSE, double_values);
				break;
			case UNIFORM_FUNCTION_MATRIX2X4DV:
				gl.uniformMatrix2x4dv(uniform_location, 2, GL_FALSE, double_values);
				break;
			case UNIFORM_FUNCTION_MATRIX3DV:
				gl.uniformMatrix3dv(uniform_location, 2, GL_FALSE, double_values);
				break;
			case UNIFORM_FUNCTION_MATRIX3X2DV:
				gl.uniformMatrix3x2dv(uniform_location, 2, GL_FALSE, double_values);
				break;
			case UNIFORM_FUNCTION_MATRIX3X4DV:
				gl.uniformMatrix3x4dv(uniform_location, 2, GL_FALSE, double_values);
				break;
			case UNIFORM_FUNCTION_MATRIX4DV:
				gl.uniformMatrix4dv(uniform_location, 2, GL_FALSE, double_values);
				break;
			case UNIFORM_FUNCTION_MATRIX4X2DV:
				gl.uniformMatrix4x2dv(uniform_location, 2, GL_FALSE, double_values);
				break;
			case UNIFORM_FUNCTION_MATRIX4X3DV:
				gl.uniformMatrix4x3dv(uniform_location, 2, GL_FALSE, double_values);
				break;

			default:
			{
				TCU_FAIL("Unrecognized uniform function");
			}
			} /* switch (uniform_function) */

			/* Make sure GL_INVALID_VALUE was generated */
			glw::GLenum error_code = gl.getError();

			if (error_code != GL_INVALID_OPERATION)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Function " << getUniformFunctionString(uniform_function)
								   << "() "
									  "was called with an invalid count argument but did not generate a "
									  "GL_INVALID_OPERATION error"
								   << tcu::TestLog::EndMessage;

				result = false;
			}
		} /* for (all non-arrayed uniforms) */
	}	 /* for (all uniform functions) */

	return result;
}